

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

send_result_t
zmq::send_multipart<std::array<zmq::message_t,1ul>&,void>
          (socket_ref s,array<zmq::message_t,_1UL> *msgs,send_flags flags)

{
  size_t in_RCX;
  undefined4 in_register_00000014;
  ulong uVar1;
  ulong extraout_RDX;
  undefined8 uVar2;
  _Storage<unsigned_long,_true> _Var3;
  int in_R8D;
  _Storage<unsigned_long,_true> _Var4;
  long lVar5;
  send_result_t sVar6;
  socket_ref s_local;
  
  uVar1 = CONCAT44(in_register_00000014,flags);
  _Var4._M_value = 0;
  _Var3._M_value = 1;
  lVar5 = 0;
  s_local.super_socket_base._handle = s.super_socket_base._handle;
  do {
    if (lVar5 == 0x40) {
      uVar2 = CONCAT71((int7)(uVar1 >> 8),1);
LAB_00141dfa:
      sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
      sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var3._M_value;
      return (send_result_t)
             sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    detail::socket_base::send
              (&s_local.super_socket_base,(int)msgs + (int)lVar5,
               (void *)(ulong)((uint)(lVar5 != 0) * 2 | flags),in_RCX,in_R8D);
    if ((extraout_RDX & 1) == 0) {
      if (lVar5 != 0) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::array<zmq::message_t, 1> &]"
                     );
      }
      uVar2 = 0;
      _Var3 = _Var4;
      goto LAB_00141dfa;
    }
    lVar5 = lVar5 + 0x40;
    _Var4._M_value = _Var4._M_value + 1;
    uVar1 = extraout_RDX;
  } while( true );
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}